

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderLocator(void *ctx,char **file,unsigned_long *line)

{
  long lVar1;
  unsigned_long uVar2;
  xmlDocPtr doc;
  int ret;
  long res;
  xmlTextReaderPtr reader;
  unsigned_long *line_local;
  char **file_local;
  void *ctx_local;
  
  if ((ctx == (void *)0x0) || ((file == (char **)0x0 && (line == (unsigned_long *)0x0)))) {
    ctx_local._4_4_ = -1;
  }
  else {
    if (file != (char **)0x0) {
      *file = (char *)0x0;
    }
    if (line != (unsigned_long *)0x0) {
      *line = 0;
    }
    if ((*(long *)((long)ctx + 0x20) == 0) || (*(long *)(*(long *)((long)ctx + 0x20) + 0x38) == 0))
    {
      if (*(long *)((long)ctx + 0x70) == 0) {
        ctx_local._4_4_ = -1;
      }
      else {
        doc._4_4_ = 0;
        if (line != (unsigned_long *)0x0) {
          uVar2 = xmlGetLineNo(*(xmlNode **)((long)ctx + 0x70));
          if ((long)uVar2 < 1) {
            doc._4_4_ = -1;
          }
          else {
            *line = uVar2;
          }
        }
        if (file != (char **)0x0) {
          lVar1 = *(long *)(*(long *)((long)ctx + 0x70) + 0x40);
          if ((lVar1 == 0) || (*(long *)(lVar1 + 0x88) == 0)) {
            doc._4_4_ = -1;
          }
          else {
            *file = *(char **)(lVar1 + 0x88);
          }
        }
        ctx_local._4_4_ = doc._4_4_;
      }
    }
    else {
      if (file != (char **)0x0) {
        *file = *(char **)(*(long *)(*(long *)((long)ctx + 0x20) + 0x38) + 8);
      }
      if (line != (unsigned_long *)0x0) {
        *line = (long)*(int *)(*(long *)(*(long *)((long)ctx + 0x20) + 0x38) + 0x34);
      }
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int
xmlTextReaderLocator(void *ctx, const char **file, unsigned long *line) {
    xmlTextReaderPtr reader;

    if ((ctx == NULL) || ((file == NULL) && (line == NULL)))
        return(-1);

    if (file != NULL)
        *file = NULL;
    if (line != NULL)
        *line = 0;

    reader = (xmlTextReaderPtr) ctx;
    if ((reader->ctxt != NULL) && (reader->ctxt->input != NULL)) {
	if (file != NULL)
	    *file = reader->ctxt->input->filename;
	if (line != NULL)
	    *line = reader->ctxt->input->line;
	return(0);
    }
    if (reader->node != NULL) {
        long res;
	int ret = 0;

	if (line != NULL) {
	    res = xmlGetLineNo(reader->node);
	    if (res > 0)
	        *line = (unsigned long) res;
	    else
                ret = -1;
	}
        if (file != NULL) {
	    xmlDocPtr doc = reader->node->doc;
	    if ((doc != NULL) && (doc->URL != NULL))
	        *file = (const char *) doc->URL;
	    else
                ret = -1;
	}
	return(ret);
    }
    return(-1);
}